

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DebugHookIdInfo(ImGuiID id,ImGuiDataType data_type,void *data_id,void *data_id_end)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  ImGuiStackLevelInfo *__dest;
  size_t sVar4;
  long lVar5;
  ImGuiStackLevelInfo *pIVar6;
  char *pcVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  
  pIVar3 = GImGui;
  uVar8 = (ulong)id;
  pIVar2 = GImGui->CurrentWindow;
  iVar1 = (GImGui->DebugIDStackTool).StackLevel;
  lVar11 = (long)iVar1;
  if (lVar11 == -1) {
    (GImGui->DebugIDStackTool).StackLevel = 0;
    iVar1 = (pIVar2->IDStack).Size;
    iVar12 = (pIVar3->DebugIDStackTool).Results.Capacity;
    iVar10 = (int)((long)iVar1 + 1);
    if (iVar12 <= iVar1) {
      if (iVar12 == 0) {
        iVar12 = 8;
      }
      else {
        iVar12 = iVar12 / 2 + iVar12;
      }
      if (iVar12 <= iVar10) {
        iVar12 = iVar10;
      }
      __dest = (ImGuiStackLevelInfo *)MemAlloc((long)iVar12 << 6);
      pIVar6 = (pIVar3->DebugIDStackTool).Results.Data;
      if (pIVar6 != (ImGuiStackLevelInfo *)0x0) {
        memcpy(__dest,pIVar6,(long)(pIVar3->DebugIDStackTool).Results.Size << 6);
        MemFree((pIVar3->DebugIDStackTool).Results.Data);
      }
      (pIVar3->DebugIDStackTool).Results.Data = __dest;
      (pIVar3->DebugIDStackTool).Results.Capacity = iVar12;
    }
    iVar12 = (pIVar3->DebugIDStackTool).Results.Size;
    if (iVar12 <= iVar1) {
      lVar5 = ((long)iVar1 + 1) - (long)iVar12;
      lVar11 = (long)iVar12 << 6;
      do {
        pIVar6 = (pIVar3->DebugIDStackTool).Results.Data;
        pcVar7 = pIVar6->Desc + lVar11 + 0x29;
        pcVar7[0] = '\0';
        pcVar7[1] = '\0';
        pcVar7[2] = '\0';
        pcVar7[3] = '\0';
        pcVar7[4] = '\0';
        pcVar7[5] = '\0';
        pcVar7[6] = '\0';
        pcVar7[7] = '\0';
        pcVar7[8] = '\0';
        pcVar7[9] = '\0';
        pcVar7[10] = '\0';
        pcVar7[0xb] = '\0';
        pcVar7[0xc] = '\0';
        pcVar7[0xd] = '\0';
        pcVar7[0xe] = '\0';
        pcVar7[0xf] = '\0';
        pcVar7 = pIVar6->Desc + lVar11 + 0x19;
        pcVar7[0] = '\0';
        pcVar7[1] = '\0';
        pcVar7[2] = '\0';
        pcVar7[3] = '\0';
        pcVar7[4] = '\0';
        pcVar7[5] = '\0';
        pcVar7[6] = '\0';
        pcVar7[7] = '\0';
        pcVar7[8] = '\0';
        pcVar7[9] = '\0';
        pcVar7[10] = '\0';
        pcVar7[0xb] = '\0';
        pcVar7[0xc] = '\0';
        pcVar7[0xd] = '\0';
        pcVar7[0xe] = '\0';
        pcVar7[0xf] = '\0';
        pcVar7 = pIVar6->Desc + lVar11 + 9;
        pcVar7[0] = '\0';
        pcVar7[1] = '\0';
        pcVar7[2] = '\0';
        pcVar7[3] = '\0';
        pcVar7[4] = '\0';
        pcVar7[5] = '\0';
        pcVar7[6] = '\0';
        pcVar7[7] = '\0';
        pcVar7[8] = '\0';
        pcVar7[9] = '\0';
        pcVar7[10] = '\0';
        pcVar7[0xb] = '\0';
        pcVar7[0xc] = '\0';
        pcVar7[0xd] = '\0';
        pcVar7[0xe] = '\0';
        pcVar7[0xf] = '\0';
        pcVar7 = pIVar6->Desc + lVar11 + -7;
        pcVar7[0] = '\0';
        pcVar7[1] = '\0';
        pcVar7[2] = '\0';
        pcVar7[3] = '\0';
        pcVar7[4] = '\0';
        pcVar7[5] = '\0';
        pcVar7[6] = '\0';
        pcVar7[7] = '\0';
        pcVar7[8] = '\0';
        pcVar7[9] = '\0';
        pcVar7[10] = '\0';
        pcVar7[0xb] = '\0';
        pcVar7[0xc] = '\0';
        pcVar7[0xd] = '\0';
        pcVar7[0xe] = '\0';
        pcVar7[0xf] = '\0';
        lVar11 = lVar11 + 0x40;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    (pIVar3->DebugIDStackTool).Results.Size = iVar10;
    iVar1 = (pIVar2->IDStack).Size;
    if ((long)iVar1 < 0) {
      return;
    }
    pIVar6 = (pIVar3->DebugIDStackTool).Results.Data;
    uVar8 = 0;
    do {
      uVar9 = id;
      if (uVar8 < (ulong)(long)iVar1) {
        uVar9 = (pIVar2->IDStack).Data[uVar8];
      }
      pIVar6->ID = uVar9;
      uVar8 = uVar8 + 1;
      pIVar6 = pIVar6 + 1;
    } while (iVar1 + 1 != uVar8);
    return;
  }
  if (iVar1 != (pIVar2->IDStack).Size) {
    return;
  }
  pIVar6 = (GImGui->DebugIDStackTool).Results.Data;
  if (data_type < 0xd) {
    if (data_type != 4) {
      if (data_type == 0xc) {
        if (data_id_end == (void *)0x0) {
          sVar4 = strlen((char *)data_id);
        }
        else {
          sVar4 = (long)data_id_end - (long)data_id;
        }
        ImFormatString(pIVar6[lVar11].Desc,0x39,"%.*s",sVar4,data_id);
      }
      goto LAB_0018ac0f;
    }
    pcVar7 = "%d";
    uVar8 = (ulong)data_id & 0xffffffff;
  }
  else {
    if (data_type == 0xd) {
      ImFormatString(pIVar6[lVar11].Desc,0x39,"(void*)0x%p",data_id);
      goto LAB_0018ac0f;
    }
    if (data_type != 0xe) goto LAB_0018ac0f;
    if (pIVar6[lVar11].Desc[0] != '\0') {
      return;
    }
    pcVar7 = "0x%08X [override]";
  }
  ImFormatString(pIVar6[lVar11].Desc,0x39,pcVar7,uVar8);
LAB_0018ac0f:
  pIVar6[lVar11].QuerySuccess = true;
  pIVar6[lVar11].field_0x6 = (char)data_type;
  return;
}

Assistant:

void ImGui::DebugHookIdInfo(ImGuiID id, ImGuiDataType data_type, const void* data_id, const void* data_id_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiIDStackTool* tool = &g.DebugIDStackTool;

    // Step 0: stack query
    // This assumes that the ID was computed with the current ID stack, which tends to be the case for our widget.
    if (tool->StackLevel == -1)
    {
        tool->StackLevel++;
        tool->Results.resize(window->IDStack.Size + 1, ImGuiStackLevelInfo());
        for (int n = 0; n < window->IDStack.Size + 1; n++)
            tool->Results[n].ID = (n < window->IDStack.Size) ? window->IDStack[n] : id;
        return;
    }

    // Step 1+: query for individual level
    IM_ASSERT(tool->StackLevel >= 0);
    if (tool->StackLevel != window->IDStack.Size)
        return;
    ImGuiStackLevelInfo* info = &tool->Results[tool->StackLevel];
    IM_ASSERT(info->ID == id && info->QueryFrameCount > 0);

    switch (data_type)
    {
    case ImGuiDataType_S32:
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "%d", (int)(intptr_t)data_id);
        break;
    case ImGuiDataType_String:
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "%.*s", data_id_end ? (int)((const char*)data_id_end - (const char*)data_id) : (int)strlen((const char*)data_id), (const char*)data_id);
        break;
    case ImGuiDataType_Pointer:
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "(void*)0x%p", data_id);
        break;
    case ImGuiDataType_ID:
        if (info->Desc[0] != 0) // PushOverrideID() is often used to avoid hashing twice, which would lead to 2 calls to DebugHookIdInfo(). We prioritize the first one.
            return;
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "0x%08X [override]", id);
        break;
    default:
        IM_ASSERT(0);
    }
    info->QuerySuccess = true;
    info->DataType = data_type;
}